

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestAds::testAdsReadWriteReqEx2(TestAds *this,string *param_1)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  byte bVar4;
  int i;
  int iVar5;
  bool bVar6;
  uint32_t bytesRead;
  uint32_t buffer;
  string local_70;
  uint32_t outBuffer;
  uint local_4c;
  char handleName [12];
  AmsAddr unknown;
  
  builtin_strncpy(handleName,"MAIN.byByte",0xc);
  lVar1 = AdsPortOpenEx();
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 != 0,&local_70,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1db);
  std::__cxx11::string::~string((string *)&local_70);
  lVar2 = AdsSyncReadWriteReqEx2
                    (lVar1,(AmsAddr *)&server,0xf003,0,4,&local_4c,0xc,handleName,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0,&local_70,
             "0 == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(hHandle), &hHandle, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x1e2);
  std::__cxx11::string::~string((string *)&local_70);
  bVar6 = bytesRead == 4;
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_70,"sizeof(hHandle) == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1e3);
  std::__cxx11::string::~string((string *)&local_70);
  outBuffer = 0xdeadbeef;
  for (iVar5 = 0; iVar5 != 10; iVar5 = iVar5 + 1) {
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    lVar2 = AdsSyncWriteReqEx(lVar1,(AmsAddr *)&server,0xf005,local_4c,4,&outBuffer);
    if ((lVar2 != 0) != (this->super_test_base<TestAds>).super_test_root.m_reverse_mode) {
      poVar3 = std::operator<<((ostream *)&std::cout,"i");
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
      std::operator<<(poVar3,"\n");
      bVar6 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
      fructose::test_root::test_assert
                ((test_root *)this,bVar6,&local_70,
                 "0 == AdsSyncWriteReqEx(port, &server, 0xF005, hHandle, sizeof(outBuffer), &outBuffer)"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x1ee);
      std::__cxx11::string::~string((string *)&local_70);
    }
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    lVar2 = AdsSyncReadReqEx2(lVar1,(AmsAddr *)&server,0xf005,local_4c,4,&buffer,&bytesRead);
    bVar4 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
    if ((lVar2 != 0) != (bool)bVar4) {
      poVar3 = std::operator<<((ostream *)&std::cout,"i");
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
      std::operator<<(poVar3,"\n");
      bVar6 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
      fructose::test_root::test_assert
                ((test_root *)this,bVar6,&local_70,
                 "0 == AdsSyncReadReqEx2(port, &server, 0xF005, hHandle, sizeof(buffer), &buffer, &bytesRead)"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x1f2);
      std::__cxx11::string::~string((string *)&local_70);
      bVar4 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
    }
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    if ((bytesRead != 4) != (bool)(bVar4 & 1)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"i");
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
      std::operator<<(poVar3,"\n");
      bVar6 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
      fructose::test_root::test_assert
                ((test_root *)this,bVar6,&local_70,"sizeof(buffer) == bytesRead",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,499);
      std::__cxx11::string::~string((string *)&local_70);
      bVar4 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
    }
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    if ((outBuffer != buffer) != (bool)(bVar4 & 1)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"i");
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
      std::operator<<(poVar3,"\n");
      bVar6 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
      fructose::test_root::test_assert
                ((test_root *)this,bVar6,&local_70,"outBuffer == buffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,500);
      std::__cxx11::string::~string((string *)&local_70);
    }
    outBuffer = ~outBuffer;
  }
  lVar2 = AdsSyncWriteReqEx(lVar1,(AmsAddr *)&server,0xf006,0,4,&local_4c);
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0,&local_70,
             "0 == AdsSyncWriteReqEx(port, &server, 0xF006, 0, sizeof(hHandle), &hHandle)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1f8);
  std::__cxx11::string::~string((string *)&local_70);
  bytesRead = 0xdeadbeef;
  lVar2 = AdsSyncReadWriteReqEx2(0,(AmsAddr *)&server,0xf003,0,4,&buffer,0xc,handleName,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x748,&local_70,
             "ADSERR_CLIENT_PORTNOTOPEN == AdsSyncReadWriteReqEx2(0, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x1ff);
  std::__cxx11::string::~string((string *)&local_70);
  bVar6 = bytesRead == 0xdeadbeef;
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_70,"0xDEADBEEF == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x200);
  std::__cxx11::string::~string((string *)&local_70);
  bytesRead = 0xdeadbeef;
  lVar2 = AdsSyncReadWriteReqEx2(lVar1,(AmsAddr *)0x0,0xf003,0,4,&buffer,0xc,handleName,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x749,&local_70,
             "ADSERR_CLIENT_NOAMSADDR == AdsSyncReadWriteReqEx2(port, nullptr, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x207);
  std::__cxx11::string::~string((string *)&local_70);
  bVar6 = bytesRead == 0xdeadbeef;
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_70,"0xDEADBEEF == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x208);
  std::__cxx11::string::~string((string *)&local_70);
  bytesRead = 0xdeadbeef;
  AmsNetId::AmsNetId(&unknown.netId,'\x01','\x02','\x03','\x04','\x05','\x06');
  unknown.port = 0x353;
  lVar2 = AdsSyncReadWriteReqEx2
                    (lVar1,(AmsAddr *)&unknown,0xf003,0,4,&buffer,0xc,handleName,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 7,&local_70,
             "GLOBALERR_MISSING_ROUTE == AdsSyncReadWriteReqEx2(port, &unknown, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x210);
  std::__cxx11::string::~string((string *)&local_70);
  bVar6 = bytesRead == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_70,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x211);
  std::__cxx11::string::~string((string *)&local_70);
  buffer = 0xdeadbeef;
  lVar2 = AdsSyncReadWriteReqEx2
                    (lVar1,(AmsAddr *)&server,0xf003,0,4,&buffer,0xc,handleName,(uint *)0x0);
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0,&local_70,
             "0 == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), handleName, nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x218);
  std::__cxx11::string::~string((string *)&local_70);
  bVar6 = buffer != 0xdeadbeef;
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_70,"0xDEADBEEF != buffer",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x219);
  std::__cxx11::string::~string((string *)&local_70);
  lVar2 = AdsSyncReadWriteReqEx2
                    (lVar1,(AmsAddr *)&server,0xf003,0,4,(void *)0x0,0xc,handleName,(uint *)0x0);
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x741,&local_70,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), nullptr, sizeof(handleName), handleName, nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x21f);
  std::__cxx11::string::~string((string *)&local_70);
  lVar2 = AdsSyncReadWriteReqEx2
                    (lVar1,(AmsAddr *)&server,0xf003,0,4,(void *)0x0,0xc,handleName,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x741,&local_70,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), nullptr, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x223);
  std::__cxx11::string::~string((string *)&local_70);
  bytesRead = 0xdeadbeef;
  lVar2 = AdsSyncReadWriteReqEx2
                    (lVar1,(AmsAddr *)&server,0xf003,0,0,&buffer,0xc,handleName,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x705,&local_70,
             "ADSERR_DEVICE_INVALIDSIZE == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, 0, &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x229);
  std::__cxx11::string::~string((string *)&local_70);
  bVar6 = bytesRead == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_70,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x22a);
  std::__cxx11::string::~string((string *)&local_70);
  lVar2 = AdsSyncReadWriteReqEx2
                    (lVar1,(AmsAddr *)&server,0xf003,0,4,&buffer,0xc,(void *)0x0,(uint *)0x0);
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x741,&local_70,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), nullptr, nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x230);
  std::__cxx11::string::~string((string *)&local_70);
  lVar2 = AdsSyncReadWriteReqEx2
                    (lVar1,(AmsAddr *)&server,0xf003,0,4,&buffer,0xc,(void *)0x0,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x741,&local_70,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), nullptr, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x234);
  std::__cxx11::string::~string((string *)&local_70);
  bytesRead = 0xdeadbeef;
  lVar2 = AdsSyncReadWriteReqEx2
                    (lVar1,(AmsAddr *)&server,0xf003,0,4,&buffer,0,handleName,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x710,&local_70,
             "ADSERR_DEVICE_SYMBOLNOTFOUND == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, 0, handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x23a);
  std::__cxx11::string::~string((string *)&local_70);
  bVar6 = bytesRead == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_70,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x23b);
  std::__cxx11::string::~string((string *)&local_70);
  bytesRead = 0xdeadbeef;
  lVar2 = AdsSyncReadWriteReqEx2(lVar1,(AmsAddr *)&server,0xf003,0,4,&buffer,3,"xxx",&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x710,&local_70,
             "ADSERR_DEVICE_SYMBOLNOTFOUND == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, 3, \"xxx\", &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x241);
  std::__cxx11::string::~string((string *)&local_70);
  bVar6 = bytesRead == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_70,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x242);
  std::__cxx11::string::~string((string *)&local_70);
  bytesRead = 0xdeadbeef;
  lVar2 = AdsSyncReadWriteReqEx2(lVar1,(AmsAddr *)&server,0,0,4,&buffer,0xc,handleName,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x701,&local_70,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncReadWriteReqEx2(port, &server, 0, 0, sizeof(buffer), &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x249);
  std::__cxx11::string::~string((string *)&local_70);
  bVar6 = bytesRead == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_70,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x24a);
  std::__cxx11::string::~string((string *)&local_70);
  bytesRead = 0xdeadbeef;
  lVar2 = AdsSyncReadWriteReqEx2
                    (lVar1,(AmsAddr *)&server,0x4025,0x10000,4,&buffer,0xc,handleName,&bytesRead);
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0x701,&local_70,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncReadWriteReqEx2(port, &server, 0x4025, 0x10000, sizeof(buffer), &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x251);
  std::__cxx11::string::~string((string *)&local_70);
  bVar6 = bytesRead == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar6,&local_70,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x252);
  std::__cxx11::string::~string((string *)&local_70);
  lVar1 = AdsPortCloseEx(lVar1);
  fructose::test_root::get_test_name_abi_cxx11_(&local_70,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,&local_70,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x253);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void testAdsReadWriteReqEx2(const std::string&)
    {
        char handleName[] = "MAIN.byByte";
        const long port = AdsPortOpenEx();
        fructose_assert(0 != port);

        uint32_t hHandle;
        uint32_t bytesRead;
        fructose_assert(0 ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(hHandle), &hHandle, sizeof(handleName),
                                               handleName,
                                               &bytesRead));
        fructose_assert(sizeof(hHandle) == bytesRead);
        hHandle = bhf::ads::letoh(hHandle);

        uint32_t buffer;
        uint32_t outBuffer = 0xDEADBEEF;
        for (int i = 0; i < NUM_TEST_LOOPS; ++i) {
            fructose_loop_assert(i, 0 == AdsSyncWriteReqEx(port,
                                                           &server,
                                                           0xF005,
                                                           hHandle,
                                                           sizeof(outBuffer),
                                                           &outBuffer));
            fructose_loop_assert(i,
                                 0 ==
                                 AdsSyncReadReqEx2(port, &server, 0xF005, hHandle, sizeof(buffer), &buffer,
                                                   &bytesRead));
            fructose_loop_assert(i, sizeof(buffer) == bytesRead);
            fructose_loop_assert(i, outBuffer == buffer);
            outBuffer = ~outBuffer;
        }
        hHandle = bhf::ads::htole(hHandle);
        fructose_assert(0 == AdsSyncWriteReqEx(port, &server, 0xF006, 0, sizeof(hHandle), &hHandle));

        // provide out of range port
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_CLIENT_PORTNOTOPEN ==
                        AdsSyncReadWriteReqEx2(0, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               handleName,
                                               &bytesRead));
        fructose_assert(0xDEADBEEF == bytesRead); // BUG? TcAdsDll doesn't reset bytesRead!

        // provide nullptr to AmsAddr
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_CLIENT_NOAMSADDR ==
                        AdsSyncReadWriteReqEx2(port, nullptr, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               handleName,
                                               &bytesRead));
        fructose_assert(0xDEADBEEF == bytesRead); // BUG? TcAdsDll doesn't reset bytesRead!

        // provide unknown AmsAddr
        bytesRead = 0xDEADBEEF;
        AmsAddr unknown { { 1, 2, 3, 4, 5, 6 }, AMSPORT_R0_PLC_TC3 };
        fructose_assert(GLOBALERR_MISSING_ROUTE ==
                        AdsSyncReadWriteReqEx2(port, &unknown, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               handleName,
                                               &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide nullptr to bytesRead
        buffer = 0xDEADBEEF;
        fructose_assert(0 ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               handleName,
                                               nullptr));
        fructose_assert(0xDEADBEEF != buffer);

        // provide nullptr to readBuffer
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), nullptr, sizeof(handleName),
                                               handleName,
                                               nullptr));
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), nullptr, sizeof(handleName),
                                               handleName,
                                               &bytesRead));

        // provide 0 length readBuffer
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_INVALIDSIZE ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, 0, &buffer, sizeof(handleName), handleName,
                                               &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide nullptr to writeBuffer
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               nullptr,
                                               nullptr));
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               nullptr,
                                               &bytesRead));

        // provide 0 length writeBuffer
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SYMBOLNOTFOUND ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, 0, handleName,
                                               &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide invalid writeBuffer
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SYMBOLNOTFOUND ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, 3, "xxx",
                                               &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide invalid indexGroup
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncReadWriteReqEx2(port, &server, 0, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               handleName,
                                               &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide invalid indexOffset
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncReadWriteReqEx2(port, &server, 0x4025, 0x10000, sizeof(buffer), &buffer,
                                               sizeof(handleName), handleName,
                                               &bytesRead));
        fructose_assert(0 == bytesRead);
        fructose_assert(0 == AdsPortCloseEx(port));
    }